

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O0

float tcu::fuzzyCompare(FuzzyCompareParams *params,ConstPixelBufferAccess *ref,
                       ConstPixelBufferAccess *cmp,PixelBufferAccess *errorMask)

{
  bool bVar1;
  int width_00;
  int height_00;
  deUint32 dVar2;
  TextureFormat *pTVar3;
  InternalError *this;
  reference pvVar4;
  size_type sVar5;
  undefined1 auVar6 [16];
  int local_318;
  ulong local_300;
  deUint64 colScale4;
  deUint64 colScale;
  double pSamples;
  float local_278;
  undefined1 local_274 [4];
  float rF;
  float local_264;
  float local_260;
  float luma;
  float red;
  float err4;
  float err2;
  int scale;
  deUint64 newSum4;
  deUint32 local_240;
  deUint32 minDist2;
  deUint32 minDist2CmpToRef;
  deUint32 minDist2RefToCmp;
  int x;
  int y;
  undefined1 local_208 [8];
  ConstPixelBufferAccess cmpAccess;
  undefined1 local_1b8 [8];
  ConstPixelBufferAccess refAccess;
  ulong local_180;
  deUint64 distSum4;
  int numSamples;
  PixelBufferAccess local_148;
  PixelBufferAccess local_120;
  PixelBufferAccess local_f8;
  int local_d0;
  allocator<float> local_c9;
  int shift;
  vector<float,_std::allocator<float>_> kernel;
  undefined1 local_a8 [8];
  TextureLevel cmpFiltered;
  undefined1 local_78 [8];
  TextureLevel refFiltered;
  Random rnd;
  int height;
  int width;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *cmp_local;
  ConstPixelBufferAccess *ref_local;
  FuzzyCompareParams *params_local;
  
  pTVar3 = ConstPixelBufferAccess::getFormat(ref);
  bVar1 = isFormatSupported(pTVar3);
  if (bVar1) {
    pTVar3 = ConstPixelBufferAccess::getFormat(cmp);
    bVar1 = isFormatSupported(pTVar3);
    if (bVar1) {
      width_00 = ConstPixelBufferAccess::getWidth(ref);
      height_00 = ConstPixelBufferAccess::getHeight(ref);
      de::Random::Random((Random *)((long)&refFiltered.m_data.m_cap + 4),0x29b);
      TextureFormat::TextureFormat((TextureFormat *)&cmpFiltered.m_data.m_cap,RGBA,UNORM_INT8);
      TextureLevel::TextureLevel
                ((TextureLevel *)local_78,(TextureFormat *)&cmpFiltered.m_data.m_cap,width_00,
                 height_00,1);
      TextureFormat::TextureFormat
                ((TextureFormat *)
                 &kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,RGBA,UNORM_INT8);
      TextureLevel::TextureLevel
                ((TextureLevel *)local_a8,
                 (TextureFormat *)
                 &kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,width_00,height_00,1);
      std::allocator<float>::allocator(&local_c9);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&shift,3,&local_c9);
      std::allocator<float>::~allocator(&local_c9);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&shift,2);
      *pvVar4 = 0.1;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&shift,0);
      *pvVar4 = 0.1;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&shift,1);
      *pvVar4 = 0.8;
      sVar5 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)&shift);
      local_d0 = ((int)sVar5 + -1) - ((int)sVar5 + -1 >> 0x1f) >> 1;
      pTVar3 = ConstPixelBufferAccess::getFormat(ref);
      if (pTVar3->order == RGB) {
        PixelBufferAccess::PixelBufferAccess(&local_120,(TextureLevel *)local_78);
        separableConvolve<4,3>
                  (&local_120,ref,local_d0,local_d0,(vector<float,_std::allocator<float>_> *)&shift,
                   (vector<float,_std::allocator<float>_> *)&shift);
      }
      else if (pTVar3->order == RGBA) {
        PixelBufferAccess::PixelBufferAccess(&local_f8,(TextureLevel *)local_78);
        separableConvolve<4,4>
                  (&local_f8,ref,local_d0,local_d0,(vector<float,_std::allocator<float>_> *)&shift,
                   (vector<float,_std::allocator<float>_> *)&shift);
      }
      pTVar3 = ConstPixelBufferAccess::getFormat(cmp);
      if (pTVar3->order == RGB) {
        PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&stack0xfffffffffffffe90,(TextureLevel *)local_a8);
        separableConvolve<4,3>
                  ((PixelBufferAccess *)&stack0xfffffffffffffe90,cmp,local_d0,local_d0,
                   (vector<float,_std::allocator<float>_> *)&shift,
                   (vector<float,_std::allocator<float>_> *)&shift);
      }
      else if (pTVar3->order == RGBA) {
        PixelBufferAccess::PixelBufferAccess(&local_148,(TextureLevel *)local_a8);
        separableConvolve<4,4>
                  (&local_148,cmp,local_d0,local_d0,(vector<float,_std::allocator<float>_> *)&shift,
                   (vector<float,_std::allocator<float>_> *)&shift);
      }
      distSum4._4_4_ = 0;
      local_180 = 0;
      Vector<float,_4>::Vector((Vector<float,_4> *)&refAccess.m_data,0.0,1.0,0.0,1.0);
      clear(errorMask,(Vec4 *)&refAccess.m_data);
      TextureLevel::getAccess((PixelBufferAccess *)&cmpAccess.m_data,(TextureLevel *)local_78);
      ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_1b8,(ConstPixelBufferAccess *)&cmpAccess.m_data);
      TextureLevel::getAccess((PixelBufferAccess *)&x,(TextureLevel *)local_a8);
      ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_208,(ConstPixelBufferAccess *)&x);
      for (minDist2RefToCmp = 1; (int)minDist2RefToCmp < height_00 + -1;
          minDist2RefToCmp = minDist2RefToCmp + 1) {
        for (minDist2CmpToRef = 1; (int)minDist2CmpToRef < width_00 + -1;
            minDist2CmpToRef = local_318 + minDist2CmpToRef) {
          dVar2 = readUnorm8<4>((ConstPixelBufferAccess *)local_1b8,minDist2CmpToRef,
                                minDist2RefToCmp);
          minDist2 = distSquaredToNeighbor<4>
                               ((Random *)((long)&refFiltered.m_data.m_cap + 4),dVar2,
                                (ConstPixelBufferAccess *)local_208,minDist2CmpToRef,
                                minDist2RefToCmp);
          dVar2 = readUnorm8<4>((ConstPixelBufferAccess *)local_208,minDist2CmpToRef,
                                minDist2RefToCmp);
          local_240 = distSquaredToNeighbor<4>
                                ((Random *)((long)&refFiltered.m_data.m_cap + 4),dVar2,
                                 (ConstPixelBufferAccess *)local_1b8,minDist2CmpToRef,
                                 minDist2RefToCmp);
          newSum4._4_4_ = de::min<unsigned_int>(minDist2,local_240);
          _err2 = local_180 + newSum4._4_4_ * newSum4._4_4_;
          local_300 = _err2;
          if (_err2 < local_180) {
            local_300 = 0xffffffffffffffff;
          }
          local_180 = local_300;
          distSum4._4_4_ = distSum4._4_4_ + 1;
          err4 = 3.51726e-43;
          red = (float)newSum4._4_4_ / 63001.0;
          luma = red * red;
          local_260 = luma * 500.0;
          ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_274,(int)cmp,minDist2CmpToRef,minDist2RefToCmp)
          ;
          local_264 = toGrayscale((Vec4 *)local_274);
          local_278 = local_264 * 0.3 + 0.7;
          Vector<float,_4>::Vector
                    ((Vector<float,_4> *)&pSamples,local_260 * local_278,
                     (1.0 - local_260) * local_278,0.0,1.0);
          PixelBufferAccess::setPixel
                    (errorMask,(Vec4 *)&pSamples,minDist2CmpToRef,minDist2RefToCmp,0);
          if (params->maxSampleSkip < 1) {
            local_318 = 1;
          }
          else {
            local_318 = de::Random::getInt((Random *)((long)&refFiltered.m_data.m_cap + 4),0,
                                           params->maxSampleSkip);
          }
        }
      }
      auVar6._8_4_ = (int)(local_180 >> 0x20);
      auVar6._0_8_ = local_180;
      auVar6._12_4_ = 0x45300000;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&shift);
      TextureLevel::~TextureLevel((TextureLevel *)local_a8);
      TextureLevel::~TextureLevel((TextureLevel *)local_78);
      de::Random::~Random((Random *)((long)&refFiltered.m_data.m_cap + 4));
      return (float)((((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_180) - 4503599627370496.0)) /
                     3969126001.0) *
                    ((double)((width_00 + -2) * (height_00 + -2)) / (double)distSum4._4_4_));
    }
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,"Unsupported format in fuzzy comparison",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFuzzyImageCompare.cpp"
             ,0x117);
  __cxa_throw(this,&InternalError::typeinfo,InternalError::~InternalError);
}

Assistant:

float fuzzyCompare (const FuzzyCompareParams& params, const ConstPixelBufferAccess& ref, const ConstPixelBufferAccess& cmp, const PixelBufferAccess& errorMask)
{
	DE_ASSERT(ref.getWidth() == cmp.getWidth() && ref.getHeight() == cmp.getHeight());
	DE_ASSERT(errorMask.getWidth() == ref.getWidth() && errorMask.getHeight() == ref.getHeight());

	if (!isFormatSupported(ref.getFormat()) || !isFormatSupported(cmp.getFormat()))
		throw InternalError("Unsupported format in fuzzy comparison", DE_NULL, __FILE__, __LINE__);

	int			width	= ref.getWidth();
	int			height	= ref.getHeight();
	de::Random	rnd		(667);

	// Filtered
	TextureLevel refFiltered(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), width, height);
	TextureLevel cmpFiltered(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), width, height);

	// Kernel = {0.1, 0.8, 0.1}
	vector<float> kernel(3);
	kernel[0] = kernel[2] = 0.1f; kernel[1]= 0.8f;
	int shift = (int)(kernel.size() - 1) / 2;

	switch (ref.getFormat().order)
	{
		case TextureFormat::RGBA:	separableConvolve<4, 4>(refFiltered, ref, shift, shift, kernel, kernel);	break;
		case TextureFormat::RGB:	separableConvolve<4, 3>(refFiltered, ref, shift, shift, kernel, kernel);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (cmp.getFormat().order)
	{
		case TextureFormat::RGBA:	separableConvolve<4, 4>(cmpFiltered, cmp, shift, shift, kernel, kernel);	break;
		case TextureFormat::RGB:	separableConvolve<4, 3>(cmpFiltered, cmp, shift, shift, kernel, kernel);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	int			numSamples	= 0;
	deUint64	distSum4	= 0ull;

	// Clear error mask to green.
	clear(errorMask, Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	ConstPixelBufferAccess refAccess = refFiltered.getAccess();
	ConstPixelBufferAccess cmpAccess = cmpFiltered.getAccess();

	for (int y = 1; y < height-1; y++)
	{
		for (int x = 1; x < width-1; x += params.maxSampleSkip > 0 ? (int)rnd.getInt(0, params.maxSampleSkip) : 1)
		{
			const deUint32	minDist2RefToCmp	= distSquaredToNeighbor<4>(rnd, readUnorm8<4>(refAccess, x, y), cmpAccess, x, y);
			const deUint32	minDist2CmpToRef	= distSquaredToNeighbor<4>(rnd, readUnorm8<4>(cmpAccess, x, y), refAccess, x, y);
			const deUint32	minDist2			= de::min(minDist2RefToCmp, minDist2CmpToRef);
			const deUint64	newSum4				= distSum4 + minDist2*minDist2;

			distSum4	 = (newSum4 >= distSum4) ? newSum4 : ~0ull; // In case of overflow
			numSamples	+= 1;

			// Build error image.
			{
				const int	scale	= 255-MIN_ERR_THRESHOLD;
				const float	err2	= float(minDist2) / float(scale*scale);
				const float	err4	= err2*err2;
				const float	red		= err4 * 500.0f;
				const float	luma	= toGrayscale(cmp.getPixel(x, y));
				const float	rF		= 0.7f + 0.3f*luma;

				errorMask.setPixel(Vec4(red*rF, (1.0f-red)*rF, 0.0f, 1.0f), x, y);
			}
		}
	}

	{
		// Scale error sum based on number of samples taken
		const double	pSamples	= double((width-2) * (height-2)) / double(numSamples);
		const deUint64	colScale	= deUint64(255-MIN_ERR_THRESHOLD);
		const deUint64	colScale4	= colScale*colScale*colScale*colScale;

		return float(double(distSum4) / double(colScale4) * pSamples);
	}
}